

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::GELU_x86_avx512::forward_inplace(GELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  __m512 x;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined1 auVar68 [24];
  long *in_RSI;
  long in_RDI;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  float fVar74;
  undefined8 uVar75;
  float fVar77;
  float fVar78;
  undefined8 uVar79;
  float fVar81;
  float fVar82;
  undefined8 uVar80;
  float fVar83;
  undefined8 uVar84;
  float fVar85;
  float fVar86;
  undefined8 uVar87;
  undefined1 auVar76 [32];
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  v4sf afVar92;
  __m128 _blob_2;
  __m128 _cube_2;
  __m128 _pLoad_2;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  __m256 _blob_1;
  __m256 _cube_1;
  __m256 _pLoad_1;
  __m256 _fast2c256;
  __m256 _fast1c256;
  __m256 _one256;
  __m256 _half256;
  __m512 _blob;
  __m512 _cube;
  __m512 _pLoad;
  __m512 _fast2c512;
  __m512 _fast1c512;
  __m512 _one512;
  __m512 _half512;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 dst;
  __m256 q_1;
  __m256 p;
  __m256 value_squared;
  __m256 value;
  undefined8 local_1690;
  undefined8 uStackY_1688;
  undefined8 local_1620;
  undefined8 uStackY_1618;
  undefined8 uStackY_1610;
  undefined8 uStackY_1608;
  Option *in_stack_ffffffffffffea38;
  Mat *in_stack_ffffffffffffea40;
  GELU *in_stack_ffffffffffffea48;
  undefined8 in_stack_ffffffffffffea50;
  undefined8 in_stack_ffffffffffffea58;
  undefined8 in_stack_ffffffffffffea60;
  undefined8 in_stack_ffffffffffffea68;
  undefined8 in_stack_ffffffffffffea70;
  undefined1 local_1540 [16];
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  int local_1358;
  undefined8 local_1348;
  undefined8 local_1340;
  undefined8 local_1338;
  undefined4 local_1330;
  long local_1328;
  undefined4 local_1320;
  undefined4 local_131c;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined8 local_1308;
  undefined1 (*local_1300) [64];
  int local_12f4;
  int local_12f0;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  int local_12e0;
  int local_12dc;
  long *local_12d0;
  int local_12bc;
  undefined1 local_12b5;
  int local_12b4;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  undefined8 *local_1290;
  undefined1 local_1280 [64];
  undefined4 local_1204;
  undefined1 local_1200 [64];
  undefined4 local_1184;
  undefined1 local_1180 [64];
  undefined4 local_1104;
  undefined1 local_1100 [64];
  undefined4 local_108c;
  undefined1 (*local_1088) [64];
  undefined1 local_1080 [64];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 (*local_c20) [64];
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined1 (*local_c08) [64];
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  Option *pOStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  Option *pOStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  Option *pOStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  Option *pOStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  ulong uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 (*local_898) [64];
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined4 local_81c;
  undefined1 (*local_818) [64];
  float local_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 (*local_6f8) [64];
  long local_6f0;
  undefined4 local_6e4;
  long local_6e0;
  undefined1 (*local_6d8) [64];
  undefined4 local_6cc;
  int local_6c8;
  int local_6c4;
  undefined8 *local_6c0;
  undefined4 local_6b4;
  long local_6b0;
  undefined8 *local_690;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined1 local_5a0 [16];
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  float *local_4d8;
  float *local_4d0;
  undefined1 *local_4c8;
  float *local_4c0;
  float *local_4b8;
  undefined1 *local_4b0;
  float *local_4a8;
  float *local_4a0;
  float *local_498;
  float *local_490;
  float *local_488;
  undefined1 *local_480;
  float *local_478;
  float *local_470;
  undefined1 *local_468;
  float *local_460;
  float *local_458;
  undefined1 *local_450;
  float *local_448;
  float *local_440;
  undefined1 *local_438;
  float *local_430;
  float *local_428;
  undefined1 *local_420;
  float *local_418;
  float *local_410;
  float *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  ulong uStack_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  float afStack_3b0 [2];
  float afStack_3a8 [2];
  float local_3a0 [2];
  float afStack_398 [2];
  float afStack_390 [2];
  float afStack_388 [2];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360 [2];
  float afStack_358 [2];
  float afStack_350 [2];
  float afStack_348 [2];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  float afStack_2f0 [2];
  float afStack_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  float afStack_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  float afStack_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  float afStack_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  float afStack_170 [2];
  float afStack_168 [2];
  float local_160 [2];
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  float afStack_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_12bc = GELU::forward_inplace
                           (in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,
                            in_stack_ffffffffffffea38);
  }
  else {
    local_12dc = *(int *)((long)in_RSI + 0x2c);
    local_12e0 = (int)in_RSI[6];
    local_12e4 = *(int *)((long)in_RSI + 0x34);
    local_12e8 = (int)in_RSI[3];
    local_12ec = (int)in_RSI[7];
    local_12f0 = local_12dc * local_12e0 * local_12e4 * local_12e8;
    local_12d0 = in_RSI;
    for (local_12f4 = 0; local_12f4 < local_12ec; local_12f4 = local_12f4 + 1) {
      local_12a8 = &local_1348;
      local_6c4 = *(int *)((long)local_12d0 + 0x2c);
      local_6c8 = (int)local_12d0[6];
      local_6cc = *(undefined4 *)((long)local_12d0 + 0x34);
      local_1300 = (undefined1 (*) [64])
                   (*local_12d0 + local_12d0[8] * (long)local_12f4 * local_12d0[2]);
      local_6e0 = local_12d0[2];
      local_6e4 = (undefined4)local_12d0[3];
      local_6f0 = local_12d0[4];
      local_6c0 = &local_1348;
      local_6b0 = (long)local_6c4 * (long)local_6c8 * local_6e0;
      local_12a0 = &local_1348;
      local_1290 = &local_1348;
      local_6b4 = 0x10;
      local_12b4 = local_12f4;
      local_12b5 = 1;
      local_1348 = 0;
      local_1338 = 0;
      local_1330 = 0;
      local_1320 = 0;
      local_131c = 0;
      local_1318 = 0;
      local_1314 = 0;
      local_1310 = 0;
      local_1308 = 0;
      local_1340 = 0;
      local_1358 = 0;
      local_108c = 0x3f000000;
      auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      local_1100._0_8_ = auVar69._0_8_;
      uVar60 = local_1100._0_8_;
      local_1100._8_8_ = auVar69._8_8_;
      uVar61 = local_1100._8_8_;
      local_1100._16_8_ = auVar69._16_8_;
      uVar62 = local_1100._16_8_;
      local_1100._24_8_ = auVar69._24_8_;
      uVar63 = local_1100._24_8_;
      local_1100._32_8_ = auVar69._32_8_;
      uVar64 = local_1100._32_8_;
      local_1100._40_8_ = auVar69._40_8_;
      uVar65 = local_1100._40_8_;
      local_1100._48_8_ = auVar69._48_8_;
      uVar66 = local_1100._48_8_;
      local_1100._56_8_ = auVar69._56_8_;
      uVar67 = local_1100._56_8_;
      local_1104 = 0x3f800000;
      auVar70 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_1180._0_8_ = auVar70._0_8_;
      uVar52 = local_1180._0_8_;
      local_1180._8_8_ = auVar70._8_8_;
      uVar53 = local_1180._8_8_;
      local_1180._16_8_ = auVar70._16_8_;
      uVar54 = local_1180._16_8_;
      local_1180._24_8_ = auVar70._24_8_;
      uVar55 = local_1180._24_8_;
      local_1180._32_8_ = auVar70._32_8_;
      uVar56 = local_1180._32_8_;
      local_1180._40_8_ = auVar70._40_8_;
      uVar57 = local_1180._40_8_;
      local_1180._48_8_ = auVar70._48_8_;
      uVar58 = local_1180._48_8_;
      local_1180._56_8_ = auVar70._56_8_;
      uVar59 = local_1180._56_8_;
      local_1184 = 0x3f4c4229;
      auVar71 = vbroadcastss_avx512f(ZEXT416(0x3f4c4229));
      local_1200._0_8_ = auVar71._0_8_;
      uVar44 = local_1200._0_8_;
      local_1200._8_8_ = auVar71._8_8_;
      uVar45 = local_1200._8_8_;
      local_1200._16_8_ = auVar71._16_8_;
      uVar46 = local_1200._16_8_;
      local_1200._24_8_ = auVar71._24_8_;
      uVar47 = local_1200._24_8_;
      local_1200._32_8_ = auVar71._32_8_;
      uVar48 = local_1200._32_8_;
      local_1200._40_8_ = auVar71._40_8_;
      uVar49 = local_1200._40_8_;
      local_1200._48_8_ = auVar71._48_8_;
      uVar50 = local_1200._48_8_;
      local_1200._56_8_ = auVar71._56_8_;
      uVar51 = local_1200._56_8_;
      local_1204 = 0x3d372713;
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x3d372713));
      local_1280._0_8_ = auVar72._0_8_;
      uVar5 = local_1280._0_8_;
      local_1280._8_8_ = auVar72._8_8_;
      uVar6 = local_1280._8_8_;
      local_1280._16_8_ = auVar72._16_8_;
      uVar80 = local_1280._16_8_;
      local_1280._24_8_ = auVar72._24_8_;
      uVar39 = local_1280._24_8_;
      local_1280._32_8_ = auVar72._32_8_;
      uVar40 = local_1280._32_8_;
      local_1280._40_8_ = auVar72._40_8_;
      uVar41 = local_1280._40_8_;
      local_1280._48_8_ = auVar72._48_8_;
      uVar42 = local_1280._48_8_;
      local_1280._56_8_ = auVar72._56_8_;
      uVar43 = local_1280._56_8_;
      local_1280 = auVar72;
      local_1200 = auVar71;
      local_1180 = auVar70;
      local_1100 = auVar69;
      local_6d8 = local_1300;
      local_690 = local_1290;
      local_1328 = local_6f0;
      for (; local_1358 + 0xf < local_12f0; local_1358 = local_1358 + 0x10) {
        local_1088 = local_1300;
        uVar7 = *(undefined8 *)*local_1300;
        uVar8 = *(undefined8 *)(*local_1300 + 8);
        uVar9 = *(undefined8 *)(*local_1300 + 0x10);
        uVar10 = *(undefined8 *)(*local_1300 + 0x18);
        uVar11 = *(undefined8 *)(*local_1300 + 0x20);
        uVar12 = *(undefined8 *)(*local_1300 + 0x28);
        uVar13 = *(undefined8 *)(*local_1300 + 0x30);
        uVar14 = *(undefined8 *)(*local_1300 + 0x38);
        auVar29 = *local_1300;
        auVar73 = vmulps_avx512f(*local_1300,*local_1300);
        local_1500 = auVar73._0_8_;
        uStack_14f8 = auVar73._8_8_;
        uStack_14f0 = auVar73._16_8_;
        uStack_14e8 = auVar73._24_8_;
        uStack_14e0 = auVar73._32_8_;
        uStack_14d8 = auVar73._40_8_;
        uStack_14d0 = auVar73._48_8_;
        uStack_14c8 = auVar73._56_8_;
        local_e80 = local_1500;
        uStack_e78 = uStack_14f8;
        uStack_e70 = uStack_14f0;
        uStack_e68 = uStack_14e8;
        uStack_e60 = uStack_14e0;
        uStack_e58 = uStack_14d8;
        uStack_e50 = uStack_14d0;
        uStack_e48 = uStack_14c8;
        auVar73 = vmulps_avx512f(*local_1300,auVar73);
        local_1500 = auVar73._0_8_;
        uStack_14f8 = auVar73._8_8_;
        uStack_14f0 = auVar73._16_8_;
        uStack_14e8 = auVar73._24_8_;
        uStack_14e0 = auVar73._32_8_;
        uStack_14d8 = auVar73._40_8_;
        uStack_14d0 = auVar73._48_8_;
        uStack_14c8 = auVar73._56_8_;
        local_ec0 = uVar5;
        uStack_eb8 = uVar6;
        uStack_eb0 = uVar80;
        uStack_ea8 = uVar39;
        uStack_ea0 = uVar40;
        uStack_e98 = uVar41;
        uStack_e90 = uVar42;
        uStack_e88 = uVar43;
        local_f00 = local_1500;
        uStack_ef8 = uStack_14f8;
        uStack_ef0 = uStack_14f0;
        uStack_ee8 = uStack_14e8;
        uStack_ee0 = uStack_14e0;
        uStack_ed8 = uStack_14d8;
        uStack_ed0 = uStack_14d0;
        uStack_ec8 = uStack_14c8;
        auVar73 = vmulps_avx512f(auVar72,auVar73);
        local_1540._0_8_ = auVar73._0_8_;
        local_1540._8_8_ = auVar73._8_8_;
        uStack_1530 = auVar73._16_8_;
        uStack_1528 = auVar73._24_8_;
        uStack_1520 = auVar73._32_8_;
        uStack_1518 = auVar73._40_8_;
        uStack_1510 = auVar73._48_8_;
        uStack_1508 = auVar73._56_8_;
        local_d00 = local_1540._0_8_;
        uStack_cf8 = local_1540._8_8_;
        uStack_cf0 = uStack_1530;
        uStack_ce8 = uStack_1528;
        uStack_ce0 = uStack_1520;
        uStack_cd8 = uStack_1518;
        uStack_cd0 = uStack_1510;
        uStack_cc8 = uStack_1508;
        auVar73 = vaddps_avx512f(*local_1300,auVar73);
        local_1540._0_8_ = auVar73._0_8_;
        local_1540._8_8_ = auVar73._8_8_;
        uStack_1530 = auVar73._16_8_;
        uStack_1528 = auVar73._24_8_;
        uStack_1520 = auVar73._32_8_;
        uStack_1518 = auVar73._40_8_;
        uStack_1510 = auVar73._48_8_;
        uStack_1508 = auVar73._56_8_;
        local_f40 = uVar44;
        uStack_f38 = uVar45;
        uStack_f30 = uVar46;
        uStack_f28 = uVar47;
        uStack_f20 = uVar48;
        uStack_f18 = uVar49;
        uStack_f10 = uVar50;
        uStack_f08 = uVar51;
        local_f80 = local_1540._0_8_;
        uStack_f78 = local_1540._8_8_;
        uStack_f70 = uStack_1530;
        uStack_f68 = uStack_1528;
        uStack_f60 = uStack_1520;
        uStack_f58 = uStack_1518;
        uStack_f50 = uStack_1510;
        uStack_f48 = uStack_1508;
        auVar73 = vmulps_avx512f(auVar71,auVar73);
        local_1540._0_8_ = auVar73._0_8_;
        local_1540._8_8_ = auVar73._8_8_;
        uStack_1530 = auVar73._16_8_;
        uStack_1528 = auVar73._24_8_;
        uStack_1520 = auVar73._32_8_;
        uStack_1518 = auVar73._40_8_;
        uStack_1510 = auVar73._48_8_;
        uStack_1508 = auVar73._56_8_;
        x._8_8_ = in_stack_ffffffffffffea40;
        x._0_8_ = in_stack_ffffffffffffea38;
        x._16_8_ = in_stack_ffffffffffffea48;
        x[6] = (float)(int)in_stack_ffffffffffffea50;
        x[7] = (float)(int)((ulong)in_stack_ffffffffffffea50 >> 0x20);
        x[8] = (float)(int)in_stack_ffffffffffffea58;
        x[9] = (float)(int)((ulong)in_stack_ffffffffffffea58 >> 0x20);
        x[10] = (float)(int)in_stack_ffffffffffffea60;
        x[0xb] = (float)(int)((ulong)in_stack_ffffffffffffea60 >> 0x20);
        x[0xc] = (float)(int)in_stack_ffffffffffffea68;
        x[0xd] = (float)(int)((ulong)in_stack_ffffffffffffea68 >> 0x20);
        x[0xe] = (float)(int)in_stack_ffffffffffffea70;
        x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffea70 >> 0x20);
        uVar75 = local_1540._0_8_;
        uVar79 = local_1540._8_8_;
        uVar84 = uStack_1530;
        uVar87 = uStack_1528;
        uVar88 = uStack_1520;
        uVar89 = uStack_1518;
        uVar90 = uStack_1510;
        uVar91 = uStack_1508;
        local_e40 = uVar7;
        uStack_e38 = uVar8;
        uStack_e30 = uVar9;
        uStack_e28 = uVar10;
        uStack_e20 = uVar11;
        uStack_e18 = uVar12;
        uStack_e10 = uVar13;
        uStack_e08 = uVar14;
        local_e00 = uVar7;
        uStack_df8 = uVar8;
        uStack_df0 = uVar9;
        uStack_de8 = uVar10;
        uStack_de0 = uVar11;
        uStack_dd8 = uVar12;
        uStack_dd0 = uVar13;
        uStack_dc8 = uVar14;
        local_dc0 = uVar7;
        uStack_db8 = uVar8;
        uStack_db0 = uVar9;
        uStack_da8 = uVar10;
        uStack_da0 = uVar11;
        uStack_d98 = uVar12;
        uStack_d90 = uVar13;
        uStack_d88 = uVar14;
        local_cc0 = uVar7;
        uStack_cb8 = uVar8;
        uStack_cb0 = uVar9;
        uStack_ca8 = uVar10;
        uStack_ca0 = uVar11;
        uStack_c98 = uVar12;
        uStack_c90 = uVar13;
        uStack_c88 = uVar14;
        tanh512_ps(x);
        local_1540._8_8_ = uVar79;
        local_1540._0_8_ = uVar75;
        local_d40 = uVar52;
        uStack_d38 = uVar53;
        uStack_d30 = uVar54;
        uStack_d28 = uVar55;
        uStack_d20 = uVar56;
        uStack_d18 = uVar57;
        uStack_d10 = uVar58;
        uStack_d08 = uVar59;
        auVar73._16_8_ = uVar84;
        auVar73._0_16_ = local_1540;
        auVar73._24_8_ = uVar87;
        auVar73._32_8_ = uVar88;
        auVar73._40_8_ = uVar89;
        auVar73._48_8_ = uVar90;
        auVar73._56_8_ = uVar91;
        auVar73 = vaddps_avx512f(auVar70,auVar73);
        local_1040 = uVar60;
        uStack_1038 = uVar61;
        uStack_1030 = uVar62;
        uStack_1028 = uVar63;
        uStack_1020 = uVar64;
        uStack_1018 = uVar65;
        uStack_1010 = uVar66;
        uStack_1008 = uVar67;
        local_1540._0_8_ = auVar73._0_8_;
        local_fc0 = local_1540._0_8_;
        local_1540._8_8_ = auVar73._8_8_;
        uStack_fb8 = local_1540._8_8_;
        uStack_1530 = auVar73._16_8_;
        uStack_fb0 = uStack_1530;
        uStack_1528 = auVar73._24_8_;
        uStack_fa8 = uStack_1528;
        uStack_1520 = auVar73._32_8_;
        uStack_fa0 = uStack_1520;
        uStack_1518 = auVar73._40_8_;
        uStack_f98 = uStack_1518;
        uStack_1510 = auVar73._48_8_;
        uStack_f90 = uStack_1510;
        uStack_1508 = auVar73._56_8_;
        uStack_f88 = uStack_1508;
        local_1080 = vmulps_avx512f(auVar73,auVar29);
        auVar73 = vmulps_avx512f(auVar69,local_1080);
        local_c20 = local_1300;
        local_1540._0_8_ = auVar73._0_8_;
        local_c80 = local_1540._0_8_;
        local_1540._8_8_ = auVar73._8_8_;
        uStack_c78 = local_1540._8_8_;
        uStack_1530 = auVar73._16_8_;
        uStack_c70 = uStack_1530;
        uStack_1528 = auVar73._24_8_;
        uStack_c68 = uStack_1528;
        uStack_1520 = auVar73._32_8_;
        uStack_c60 = uStack_1520;
        uStack_1518 = auVar73._40_8_;
        uStack_c58 = uStack_1518;
        uStack_1510 = auVar73._48_8_;
        uStack_c50 = uStack_1510;
        uStack_1508 = auVar73._56_8_;
        uStack_c48 = uStack_1508;
        *(undefined8 *)*local_1300 = local_1540._0_8_;
        *(undefined8 *)(*local_1300 + 8) = local_1540._8_8_;
        *(undefined8 *)(*local_1300 + 0x10) = uStack_1530;
        *(undefined8 *)(*local_1300 + 0x18) = uStack_1528;
        *(undefined8 *)(*local_1300 + 0x20) = uStack_1520;
        *(undefined8 *)(*local_1300 + 0x28) = uStack_1518;
        *(undefined8 *)(*local_1300 + 0x30) = uStack_1510;
        *(undefined8 *)(*local_1300 + 0x38) = uStack_1508;
        local_1300 = local_1300 + 1;
        local_1000 = uVar7;
        uStack_ff8 = uVar8;
        uStack_ff0 = uVar9;
        uStack_fe8 = uVar10;
        uStack_fe0 = uVar11;
        uStack_fd8 = uVar12;
        uStack_fd0 = uVar13;
        uStack_fc8 = uVar14;
        local_d80 = uVar75;
        uStack_d78 = uVar79;
        uStack_d70 = uVar84;
        uStack_d68 = uVar87;
        uStack_d60 = uVar88;
        uStack_d58 = uVar89;
        uStack_d50 = uVar90;
        uStack_d48 = uVar91;
      }
      local_c0c = 0x3f000000;
      local_624 = 0x3f000000;
      local_628 = 0x3f000000;
      local_62c = 0x3f000000;
      local_630 = 0x3f000000;
      local_634 = 0x3f000000;
      local_638 = 0x3f000000;
      local_63c = 0x3f000000;
      local_640 = 0x3f000000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      local_660 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      auStack_650 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      local_c10 = 0x3f800000;
      local_5e4 = 0x3f800000;
      local_5e8 = 0x3f800000;
      local_5ec = 0x3f800000;
      local_5f0 = 0x3f800000;
      local_5f4 = 0x3f800000;
      local_5f8 = 0x3f800000;
      local_5fc = 0x3f800000;
      local_600 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_620 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_610 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_c14 = 0x3f4c4229;
      local_5a4 = 0x3f4c4229;
      local_5a8 = 0x3f4c4229;
      local_5ac = 0x3f4c4229;
      local_5b0 = 0x3f4c4229;
      local_5b4 = 0x3f4c4229;
      local_5b8 = 0x3f4c4229;
      local_5bc = 0x3f4c4229;
      local_5c0 = 0x3f4c4229;
      auVar1 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x20);
      local_5e0 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x20);
      auStack_5d0 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x30);
      local_c18 = 0x3d372713;
      local_564 = 0x3d372713;
      local_568 = 0x3d372713;
      local_56c = 0x3d372713;
      local_570 = 0x3d372713;
      local_574 = 0x3d372713;
      local_578 = 0x3d372713;
      local_57c = 0x3d372713;
      local_580 = 0x3d372713;
      auVar1 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d372713),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d372713),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d372713),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d372713),0x30);
      auVar76._16_16_ = auVar1;
      auVar76._0_16_ = auVar2;
      local_5a0._0_8_ = auVar2._0_8_;
      local_5a0._8_8_ = auVar2._8_8_;
      uStack_590 = auVar1._0_8_;
      uStack_588 = auVar1._8_8_;
      for (; local_1358 + 7 < local_12f0; local_1358 = local_1358 + 8) {
        local_c08 = local_1300;
        local_bc0 = *(undefined8 *)*local_1300;
        uStack_bb8 = *(undefined8 *)(*local_1300 + 8);
        uStack_bb0 = *(undefined8 *)(*local_1300 + 0x10);
        in_stack_ffffffffffffea38 = *(Option **)(*local_1300 + 0x18);
        local_aa0._0_4_ = (float)local_bc0;
        local_aa0._4_4_ = (float)((ulong)local_bc0 >> 0x20);
        uStack_a98._0_4_ = (float)uStack_bb8;
        uStack_a98._4_4_ = (float)((ulong)uStack_bb8 >> 0x20);
        uStack_a90._0_4_ = (float)uStack_bb0;
        uStack_a90._4_4_ = (float)((ulong)uStack_bb0 >> 0x20);
        uStack_a88._0_4_ = SUB84(in_stack_ffffffffffffea38,0);
        uStack_a88._4_4_ = (float)((ulong)in_stack_ffffffffffffea38 >> 0x20);
        local_b00 = CONCAT44(local_aa0._4_4_ * local_aa0._4_4_,(float)local_aa0 * (float)local_aa0);
        uStack_af8 = CONCAT44(uStack_a98._4_4_ * uStack_a98._4_4_,
                              (float)uStack_a98 * (float)uStack_a98);
        uStack_af0 = CONCAT44(uStack_a90._4_4_ * uStack_a90._4_4_,
                              (float)uStack_a90 * (float)uStack_a90);
        uStack_ae8 = CONCAT44(uStack_a88._4_4_,(float)uStack_a88 * (float)uStack_a88);
        fVar74 = (float)local_aa0 * (float)local_aa0 * (float)local_aa0;
        fVar77 = local_aa0._4_4_ * local_aa0._4_4_ * local_aa0._4_4_;
        fVar78 = (float)uStack_a98 * (float)uStack_a98 * (float)uStack_a98;
        fVar81 = uStack_a98._4_4_ * uStack_a98._4_4_ * uStack_a98._4_4_;
        fVar83 = (float)uStack_a90 * (float)uStack_a90 * (float)uStack_a90;
        fVar85 = uStack_a90._4_4_ * uStack_a90._4_4_ * uStack_a90._4_4_;
        fVar86 = (float)uStack_a88 * (float)uStack_a88 * (float)uStack_a88;
        local_b40 = CONCAT44(fVar77,fVar74);
        uStack_b38 = CONCAT44(fVar81,fVar78);
        uStack_b30 = CONCAT44(fVar85,fVar83);
        uStack_b28 = CONCAT44(uStack_a88._4_4_,fVar86);
        local_b20._0_4_ = auVar2._0_4_;
        local_b20._4_4_ = auVar2._4_4_;
        uStack_b18._0_4_ = auVar2._8_4_;
        uStack_b18._4_4_ = auVar2._12_4_;
        uStack_b10._0_4_ = auVar1._0_4_;
        uStack_b10._4_4_ = auVar1._4_4_;
        uStack_b08._0_4_ = auVar1._8_4_;
        uStack_b08._4_4_ = auVar1._12_4_;
        local_b20._0_4_ = (float)local_b20 * fVar74;
        local_b20._4_4_ = local_b20._4_4_ * fVar77;
        uStack_b18._0_4_ = (float)uStack_b18 * fVar78;
        uStack_b18._4_4_ = uStack_b18._4_4_ * fVar81;
        uStack_b10._0_4_ = (float)uStack_b10 * fVar83;
        uStack_b10._4_4_ = uStack_b10._4_4_ * fVar85;
        uStack_b08._0_4_ = (float)uStack_b08 * fVar86;
        local_1620 = CONCAT44(local_b20._4_4_,(float)local_b20);
        uStackY_1618 = CONCAT44(uStack_b18._4_4_,(float)uStack_b18);
        uStackY_1610 = CONCAT44(uStack_b10._4_4_,(float)uStack_b10);
        uStackY_1608 = CONCAT44(uStack_b08._4_4_,(float)uStack_b08);
        local_a40 = local_1620;
        uStack_a38 = uStackY_1618;
        uStack_a30 = uStackY_1610;
        uStack_a28 = uStackY_1608;
        local_b20._0_4_ = (float)local_aa0 + (float)local_b20;
        local_b20._4_4_ = local_aa0._4_4_ + local_b20._4_4_;
        uStack_b18._0_4_ = (float)uStack_a98 + (float)uStack_b18;
        uStack_b18._4_4_ = uStack_a98._4_4_ + uStack_b18._4_4_;
        uStack_b10._0_4_ = (float)uStack_a90 + (float)uStack_b10;
        uStack_b10._4_4_ = uStack_a90._4_4_ + uStack_b10._4_4_;
        uStack_b08._0_4_ = (float)uStack_a88 + (float)uStack_b08;
        local_1620 = CONCAT44(local_b20._4_4_,(float)local_b20);
        uStackY_1618 = CONCAT44(uStack_b18._4_4_,(float)uStack_b18);
        uStackY_1610 = CONCAT44(uStack_b10._4_4_,(float)uStack_b10);
        uStackY_1608 = CONCAT44(uStack_a88._4_4_ + uStack_b08._4_4_,(float)uStack_b08);
        local_b80 = local_1620;
        uStack_b78 = uStackY_1618;
        uStack_b70 = uStackY_1610;
        uStack_b68 = uStackY_1608;
        local_b60._0_4_ = local_5e0._0_4_;
        local_b60._4_4_ = local_5e0._4_4_;
        uStack_b58._0_4_ = local_5e0._8_4_;
        uStack_b58._4_4_ = local_5e0._12_4_;
        uStack_b50._0_4_ = auStack_5d0._0_4_;
        uStack_b50._4_4_ = auStack_5d0._4_4_;
        uStack_b48._0_4_ = auStack_5d0._8_4_;
        uStack_b48._4_4_ = auStack_5d0._12_4_;
        local_1620 = CONCAT44(local_b60._4_4_ * local_b20._4_4_,(float)local_b60 * (float)local_b20)
        ;
        uStackY_1618 = CONCAT44(uStack_b58._4_4_ * uStack_b18._4_4_,
                                (float)uStack_b58 * (float)uStack_b18);
        uStackY_1610 = CONCAT44(uStack_b50._4_4_ * uStack_b10._4_4_,
                                (float)uStack_b50 * (float)uStack_b10);
        uStackY_1608 = CONCAT44(uStack_b48._4_4_,(float)uStack_b48 * (float)uStack_b08);
        local_960 = local_1620;
        uStack_958 = uStackY_1618;
        uStack_950 = uStackY_1610;
        uStack_948 = uStackY_1608;
        local_980._8_8_ = uStackY_1618;
        local_980._0_8_ = local_1620;
        local_560 = local_1620;
        uStack_558 = uStackY_1618;
        uStack_550 = uStackY_1610;
        uStack_548 = uStackY_1608;
        local_540 = 0xc1100000;
        uStack_53c = 0xc1100000;
        uStack_538 = 0xc1100000;
        uStack_534 = 0xc1100000;
        uStack_530 = 0xc1100000;
        uStack_52c = 0xc1100000;
        uStack_528 = 0xc1100000;
        uStack_524 = 0xc1100000;
        auVar15._8_4_ = 0xc1100000;
        auVar15._0_8_ = 0xc1100000c1100000;
        auVar15._12_4_ = 0xc1100000;
        auVar15._16_4_ = 0xc1100000;
        auVar15._20_4_ = 0xc1100000;
        auVar15._24_4_ = 0xc1100000;
        auVar15._28_4_ = 0xc1100000;
        auVar3._16_8_ = uStackY_1610;
        auVar3._0_16_ = local_980._0_16_;
        auVar3._24_8_ = uStackY_1608;
        auVar3 = vmaxps_avx(auVar15,auVar3);
        local_980._0_8_ = auVar3._0_8_;
        local_520 = local_980._0_8_;
        local_980._8_8_ = auVar3._8_8_;
        uStack_518 = local_980._8_8_;
        local_980._16_8_ = auVar3._16_8_;
        uStack_510 = local_980._16_8_;
        local_980._24_8_ = auVar3._24_8_;
        uStack_508 = local_980._24_8_;
        local_500 = 0x41100000;
        uStack_4fc = 0x41100000;
        uStack_4f8 = 0x41100000;
        uStack_4f4 = 0x41100000;
        uStack_4f0 = 0x41100000;
        uStack_4ec = 0x41100000;
        uStack_4e8 = 0x41100000;
        uStack_4e4 = 0x41100000;
        auVar16._8_4_ = 0x41100000;
        auVar16._0_8_ = 0x4110000041100000;
        auVar16._12_4_ = 0x41100000;
        auVar16._16_4_ = 0x41100000;
        auVar16._20_4_ = 0x41100000;
        auVar16._24_4_ = 0x41100000;
        auVar16._28_4_ = 0x41100000;
        local_980 = vminps_avx(auVar16,auVar3);
        local_900 = local_980._0_8_;
        uStack_8f8 = local_980._8_8_;
        uStack_8f0 = local_980._16_8_;
        uStack_8e8 = local_980._24_8_;
        local_8e0._0_4_ = local_980._0_4_;
        local_8e0._4_4_ = local_980._4_4_;
        uStack_8d8._0_4_ = local_980._8_4_;
        uStack_8d8._4_4_ = local_980._12_4_;
        uStack_8d0._0_4_ = local_980._16_4_;
        uStack_8d0._4_4_ = local_980._20_4_;
        uStack_8c8._0_4_ = local_980._24_4_;
        uStack_8c8._4_4_ = local_980._28_4_;
        uStack_984 = uStack_8c8._4_4_;
        local_9a0 = (float)local_8e0 * (float)local_8e0;
        fStack_99c = local_8e0._4_4_ * local_8e0._4_4_;
        fStack_998 = (float)uStack_8d8 * (float)uStack_8d8;
        fStack_994 = uStack_8d8._4_4_ * uStack_8d8._4_4_;
        fStack_990 = (float)uStack_8d0 * (float)uStack_8d0;
        fStack_98c = uStack_8d0._4_4_ * uStack_8d0._4_4_;
        fStack_988 = (float)uStack_8c8 * (float)uStack_8c8;
        local_408 = &local_9a0;
        local_410 = _ps256_cephes_tanh_p0;
        local_418 = _ps256_cephes_tanh_p1;
        local_380 = CONCAT44(fStack_99c,local_9a0);
        uStack_378 = CONCAT44(fStack_994,fStack_998);
        uStack_370 = CONCAT44(fStack_98c,fStack_990);
        uStack_368 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar30._4_4_ = fStack_99c;
        auVar30._0_4_ = local_9a0;
        auVar30._8_4_ = fStack_998;
        auVar30._12_4_ = fStack_994;
        auVar30._16_4_ = fStack_990;
        auVar30._20_4_ = fStack_98c;
        auVar30._24_4_ = fStack_988;
        auVar30._28_4_ = uStack_8c8._4_4_;
        local_3a0[0] = -2.7607684e-16;
        local_3a0[1] = -2.7607684e-16;
        afStack_398[0] = -2.7607684e-16;
        afStack_398[1] = -2.7607684e-16;
        afStack_390[0] = -2.7607684e-16;
        afStack_390[1] = -2.7607684e-16;
        afStack_388[0] = -2.7607684e-16;
        afStack_388[1] = -2.7607684e-16;
        local_3c0[0] = 2.000188e-13;
        local_3c0[1] = 2.000188e-13;
        afStack_3b8[0] = 2.000188e-13;
        afStack_3b8[1] = 2.000188e-13;
        afStack_3b0[0] = 2.000188e-13;
        afStack_3b0[1] = 2.000188e-13;
        afStack_3a8[0] = 2.000188e-13;
        afStack_3a8[1] = 2.000188e-13;
        auVar19._8_4_ = -2.7607684e-16;
        auVar19._12_4_ = -2.7607684e-16;
        auVar19._0_4_ = -2.7607684e-16;
        auVar19._4_4_ = -2.7607684e-16;
        auVar19._16_4_ = -2.7607684e-16;
        auVar19._20_4_ = -2.7607684e-16;
        auVar19._24_4_ = -2.7607684e-16;
        auVar19._28_4_ = -2.7607684e-16;
        auVar18._8_4_ = 2.000188e-13;
        auVar18._12_4_ = 2.000188e-13;
        auVar18._0_4_ = 2.000188e-13;
        auVar18._4_4_ = 2.000188e-13;
        auVar18._16_4_ = 2.000188e-13;
        auVar18._20_4_ = 2.000188e-13;
        auVar18._24_4_ = 2.000188e-13;
        auVar18._28_4_ = 2.000188e-13;
        auVar4 = vfmadd213ps_fma(auVar19,auVar30,auVar18);
        local_420 = local_9c0;
        local_428 = &local_9a0;
        local_430 = _ps256_cephes_tanh_p2;
        local_9c0 = auVar4._0_8_;
        local_320 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_318 = uStack_9b8;
        uStack_310 = 0;
        uStack_308 = 0;
        local_340 = CONCAT44(fStack_99c,local_9a0);
        uStack_338 = CONCAT44(fStack_994,fStack_998);
        uStack_330 = CONCAT44(fStack_98c,fStack_990);
        uStack_328 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar31._4_4_ = fStack_99c;
        auVar31._0_4_ = local_9a0;
        auVar31._8_4_ = fStack_998;
        auVar31._12_4_ = fStack_994;
        auVar31._16_4_ = fStack_990;
        auVar31._20_4_ = fStack_98c;
        auVar31._24_4_ = fStack_988;
        auVar31._28_4_ = uStack_8c8._4_4_;
        local_360[0] = -8.604672e-11;
        local_360[1] = -8.604672e-11;
        afStack_358[0] = -8.604672e-11;
        afStack_358[1] = -8.604672e-11;
        afStack_350[0] = -8.604672e-11;
        afStack_350[1] = -8.604672e-11;
        afStack_348[0] = -8.604672e-11;
        afStack_348[1] = -8.604672e-11;
        auVar20._8_4_ = -8.604672e-11;
        auVar20._12_4_ = -8.604672e-11;
        auVar20._0_4_ = -8.604672e-11;
        auVar20._4_4_ = -8.604672e-11;
        auVar20._16_4_ = -8.604672e-11;
        auVar20._20_4_ = -8.604672e-11;
        auVar20._24_4_ = -8.604672e-11;
        auVar20._28_4_ = -8.604672e-11;
        auVar4 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar4),auVar20);
        local_438 = local_9c0;
        local_440 = &local_9a0;
        local_448 = _ps256_cephes_tanh_p3;
        local_9c0 = auVar4._0_8_;
        local_2c0 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_2b8 = uStack_9b8;
        uStack_2b0 = 0;
        uStack_2a8 = 0;
        local_2e0 = CONCAT44(fStack_99c,local_9a0);
        uStack_2d8 = CONCAT44(fStack_994,fStack_998);
        uStack_2d0 = CONCAT44(fStack_98c,fStack_990);
        uStack_2c8 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar32._4_4_ = fStack_99c;
        auVar32._0_4_ = local_9a0;
        auVar32._8_4_ = fStack_998;
        auVar32._12_4_ = fStack_994;
        auVar32._16_4_ = fStack_990;
        auVar32._20_4_ = fStack_98c;
        auVar32._24_4_ = fStack_988;
        auVar32._28_4_ = uStack_8c8._4_4_;
        local_300[0] = 5.1222973e-08;
        local_300[1] = 5.1222973e-08;
        afStack_2f8[0] = 5.1222973e-08;
        afStack_2f8[1] = 5.1222973e-08;
        afStack_2f0[0] = 5.1222973e-08;
        afStack_2f0[1] = 5.1222973e-08;
        afStack_2e8[0] = 5.1222973e-08;
        afStack_2e8[1] = 5.1222973e-08;
        auVar21._8_4_ = 5.1222973e-08;
        auVar21._12_4_ = 5.1222973e-08;
        auVar21._0_4_ = 5.1222973e-08;
        auVar21._4_4_ = 5.1222973e-08;
        auVar21._16_4_ = 5.1222973e-08;
        auVar21._20_4_ = 5.1222973e-08;
        auVar21._24_4_ = 5.1222973e-08;
        auVar21._28_4_ = 5.1222973e-08;
        auVar4 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar4),auVar21);
        local_450 = local_9c0;
        local_458 = &local_9a0;
        local_460 = _ps256_cephes_tanh_p4;
        local_9c0 = auVar4._0_8_;
        local_260 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_258 = uStack_9b8;
        uStack_250 = 0;
        uStack_248 = 0;
        local_280 = CONCAT44(fStack_99c,local_9a0);
        uStack_278 = CONCAT44(fStack_994,fStack_998);
        uStack_270 = CONCAT44(fStack_98c,fStack_990);
        uStack_268 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar33._4_4_ = fStack_99c;
        auVar33._0_4_ = local_9a0;
        auVar33._8_4_ = fStack_998;
        auVar33._12_4_ = fStack_994;
        auVar33._16_4_ = fStack_990;
        auVar33._20_4_ = fStack_98c;
        auVar33._24_4_ = fStack_988;
        auVar33._28_4_ = uStack_8c8._4_4_;
        local_2a0[0] = 1.48572235e-05;
        local_2a0[1] = 1.48572235e-05;
        afStack_298[0] = 1.48572235e-05;
        afStack_298[1] = 1.48572235e-05;
        afStack_290[0] = 1.48572235e-05;
        afStack_290[1] = 1.48572235e-05;
        afStack_288[0] = 1.48572235e-05;
        afStack_288[1] = 1.48572235e-05;
        auVar22._8_4_ = 1.48572235e-05;
        auVar22._12_4_ = 1.48572235e-05;
        auVar22._0_4_ = 1.48572235e-05;
        auVar22._4_4_ = 1.48572235e-05;
        auVar22._16_4_ = 1.48572235e-05;
        auVar22._20_4_ = 1.48572235e-05;
        auVar22._24_4_ = 1.48572235e-05;
        auVar22._28_4_ = 1.48572235e-05;
        auVar4 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar4),auVar22);
        local_468 = local_9c0;
        local_470 = &local_9a0;
        local_478 = _ps256_cephes_tanh_p5;
        local_9c0 = auVar4._0_8_;
        local_200 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_1f8 = uStack_9b8;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = CONCAT44(fStack_99c,local_9a0);
        uStack_218 = CONCAT44(fStack_994,fStack_998);
        uStack_210 = CONCAT44(fStack_98c,fStack_990);
        uStack_208 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar34._4_4_ = fStack_99c;
        auVar34._0_4_ = local_9a0;
        auVar34._8_4_ = fStack_998;
        auVar34._12_4_ = fStack_994;
        auVar34._16_4_ = fStack_990;
        auVar34._20_4_ = fStack_98c;
        auVar34._24_4_ = fStack_988;
        auVar34._28_4_ = uStack_8c8._4_4_;
        local_240[0] = 0.00063726195;
        local_240[1] = 0.00063726195;
        afStack_238[0] = 0.00063726195;
        afStack_238[1] = 0.00063726195;
        afStack_230[0] = 0.00063726195;
        afStack_230[1] = 0.00063726195;
        afStack_228[0] = 0.00063726195;
        afStack_228[1] = 0.00063726195;
        auVar23._8_4_ = 0.00063726195;
        auVar23._12_4_ = 0.00063726195;
        auVar23._0_4_ = 0.00063726195;
        auVar23._4_4_ = 0.00063726195;
        auVar23._16_4_ = 0.00063726195;
        auVar23._20_4_ = 0.00063726195;
        auVar23._24_4_ = 0.00063726195;
        auVar23._28_4_ = 0.00063726195;
        auVar4 = vfmadd213ps_fma(auVar34,ZEXT1632(auVar4),auVar23);
        local_480 = local_9c0;
        local_488 = &local_9a0;
        local_490 = _ps256_cephes_tanh_p6;
        local_9c0 = auVar4._0_8_;
        local_1a0 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_198 = uStack_9b8;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = CONCAT44(fStack_99c,local_9a0);
        uStack_1b8 = CONCAT44(fStack_994,fStack_998);
        uStack_1b0 = CONCAT44(fStack_98c,fStack_990);
        uStack_1a8 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar35._4_4_ = fStack_99c;
        auVar35._0_4_ = local_9a0;
        auVar35._8_4_ = fStack_998;
        auVar35._12_4_ = fStack_994;
        auVar35._16_4_ = fStack_990;
        auVar35._20_4_ = fStack_98c;
        auVar35._24_4_ = fStack_988;
        auVar35._28_4_ = uStack_8c8._4_4_;
        local_1e0[0] = 0.0048935246;
        local_1e0[1] = 0.0048935246;
        afStack_1d8[0] = 0.0048935246;
        afStack_1d8[1] = 0.0048935246;
        afStack_1d0[0] = 0.0048935246;
        afStack_1d0[1] = 0.0048935246;
        afStack_1c8[0] = 0.0048935246;
        afStack_1c8[1] = 0.0048935246;
        auVar24._8_4_ = 0.0048935246;
        auVar24._12_4_ = 0.0048935246;
        auVar24._0_4_ = 0.0048935246;
        auVar24._4_4_ = 0.0048935246;
        auVar24._16_4_ = 0.0048935246;
        auVar24._20_4_ = 0.0048935246;
        auVar24._24_4_ = 0.0048935246;
        auVar24._28_4_ = 0.0048935246;
        auVar4 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar4),auVar24);
        local_9c0 = auVar4._0_8_;
        uVar5 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uVar6 = uStack_9b8;
        uStack_910 = 0;
        uStack_908 = 0;
        local_940 = local_980._0_8_;
        uStack_938 = local_980._8_8_;
        uStack_930 = local_980._16_8_;
        uStack_928 = local_980._24_8_;
        local_920._0_4_ = auVar4._0_4_;
        local_920._4_4_ = auVar4._4_4_;
        uStack_918._0_4_ = auVar4._8_4_;
        uStack_918._4_4_ = auVar4._12_4_;
        uStack_8c8._0_4_ = (float)uStack_8c8 * 0.0;
        local_9c0._4_4_ = local_920._4_4_ * local_8e0._4_4_;
        local_9c0._0_4_ = (float)local_920 * (float)local_8e0;
        uStack_9b8._0_4_ = (float)uStack_918 * (float)uStack_8d8;
        uStack_9b8._4_4_ = uStack_918._4_4_ * uStack_8d8._4_4_;
        uStack_9b0._0_4_ = (float)uStack_8d0 * 0.0;
        uStack_9b0._4_4_ = uStack_8d0._4_4_ * 0.0;
        auVar68 = _local_9c0;
        uStack_9a8._0_4_ = (float)uStack_8c8;
        uStack_9a8._4_4_ = 0;
        auVar3 = _local_9c0;
        local_498 = &local_9a0;
        local_4a0 = _ps256_cephes_tanh_p7;
        local_4a8 = _ps256_cephes_tanh_p8;
        local_140 = CONCAT44(fStack_99c,local_9a0);
        uStack_138 = CONCAT44(fStack_994,fStack_998);
        uStack_130 = CONCAT44(fStack_98c,fStack_990);
        uStack_128 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar36._4_4_ = fStack_99c;
        auVar36._0_4_ = local_9a0;
        auVar36._8_4_ = fStack_998;
        auVar36._12_4_ = fStack_994;
        auVar36._16_4_ = fStack_990;
        auVar36._20_4_ = fStack_98c;
        auVar36._24_4_ = fStack_988;
        auVar36._28_4_ = uStack_8c8._4_4_;
        local_160[0] = 1.1982584e-06;
        local_160[1] = 1.1982584e-06;
        afStack_158[0] = 1.1982584e-06;
        afStack_158[1] = 1.1982584e-06;
        afStack_150[0] = 1.1982584e-06;
        afStack_150[1] = 1.1982584e-06;
        afStack_148[0] = 1.1982584e-06;
        afStack_148[1] = 1.1982584e-06;
        local_180[0] = 0.00011853471;
        local_180[1] = 0.00011853471;
        afStack_178[0] = 0.00011853471;
        afStack_178[1] = 0.00011853471;
        afStack_170[0] = 0.00011853471;
        afStack_170[1] = 0.00011853471;
        afStack_168[0] = 0.00011853471;
        afStack_168[1] = 0.00011853471;
        auVar26._8_4_ = 1.1982584e-06;
        auVar26._12_4_ = 1.1982584e-06;
        auVar26._0_4_ = 1.1982584e-06;
        auVar26._4_4_ = 1.1982584e-06;
        auVar26._16_4_ = 1.1982584e-06;
        auVar26._20_4_ = 1.1982584e-06;
        auVar26._24_4_ = 1.1982584e-06;
        auVar26._28_4_ = 1.1982584e-06;
        auVar25._8_4_ = 0.00011853471;
        auVar25._12_4_ = 0.00011853471;
        auVar25._0_4_ = 0.00011853471;
        auVar25._4_4_ = 0.00011853471;
        auVar25._16_4_ = 0.00011853471;
        auVar25._20_4_ = 0.00011853471;
        auVar25._24_4_ = 0.00011853471;
        auVar25._28_4_ = 0.00011853471;
        auVar4 = vfmadd213ps_fma(auVar26,auVar36,auVar25);
        local_4b0 = local_9e0;
        local_4b8 = &local_9a0;
        local_4c0 = _ps256_cephes_tanh_p9;
        local_9e0._0_8_ = auVar4._0_8_;
        local_e0 = local_9e0._0_8_;
        local_9e0._8_8_ = auVar4._8_8_;
        uStack_d8 = local_9e0._8_8_;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = CONCAT44(fStack_99c,local_9a0);
        uStack_f8 = CONCAT44(fStack_994,fStack_998);
        uStack_f0 = CONCAT44(fStack_98c,fStack_990);
        uStack_e8 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar37._4_4_ = fStack_99c;
        auVar37._0_4_ = local_9a0;
        auVar37._8_4_ = fStack_998;
        auVar37._12_4_ = fStack_994;
        auVar37._16_4_ = fStack_990;
        auVar37._20_4_ = fStack_98c;
        auVar37._24_4_ = fStack_988;
        auVar37._28_4_ = uStack_8c8._4_4_;
        local_120[0] = 0.0022684347;
        local_120[1] = 0.0022684347;
        afStack_118[0] = 0.0022684347;
        afStack_118[1] = 0.0022684347;
        afStack_110[0] = 0.0022684347;
        afStack_110[1] = 0.0022684347;
        afStack_108[0] = 0.0022684347;
        afStack_108[1] = 0.0022684347;
        auVar27._8_4_ = 0.0022684347;
        auVar27._12_4_ = 0.0022684347;
        auVar27._0_4_ = 0.0022684347;
        auVar27._4_4_ = 0.0022684347;
        auVar27._16_4_ = 0.0022684347;
        auVar27._20_4_ = 0.0022684347;
        auVar27._24_4_ = 0.0022684347;
        auVar27._28_4_ = 0.0022684347;
        auVar4 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar4),auVar27);
        local_4c8 = local_9e0;
        local_4d0 = &local_9a0;
        local_4d8 = _ps256_cephes_tanh_p6;
        local_9e0._0_8_ = auVar4._0_8_;
        local_80 = local_9e0._0_8_;
        local_9e0._8_8_ = auVar4._8_8_;
        uStack_78 = local_9e0._8_8_;
        uStack_70 = 0;
        uStack_68 = 0;
        local_a0 = CONCAT44(fStack_99c,local_9a0);
        uStack_98 = CONCAT44(fStack_994,fStack_998);
        uStack_90 = CONCAT44(fStack_98c,fStack_990);
        uStack_88 = CONCAT44(uStack_8c8._4_4_,fStack_988);
        auVar38._4_4_ = fStack_99c;
        auVar38._0_4_ = local_9a0;
        auVar38._8_4_ = fStack_998;
        auVar38._12_4_ = fStack_994;
        auVar38._16_4_ = fStack_990;
        auVar38._20_4_ = fStack_98c;
        auVar38._24_4_ = fStack_988;
        auVar38._28_4_ = uStack_8c8._4_4_;
        local_c0[0] = 0.0048935246;
        local_c0[1] = 0.0048935246;
        afStack_b8[0] = 0.0048935246;
        afStack_b8[1] = 0.0048935246;
        afStack_b0[0] = 0.0048935246;
        afStack_b0[1] = 0.0048935246;
        afStack_a8[0] = 0.0048935246;
        afStack_a8[1] = 0.0048935246;
        auVar28._8_4_ = 0.0048935246;
        auVar28._12_4_ = 0.0048935246;
        auVar28._0_4_ = 0.0048935246;
        auVar28._4_4_ = 0.0048935246;
        auVar28._16_4_ = 0.0048935246;
        auVar28._20_4_ = 0.0048935246;
        auVar28._24_4_ = 0.0048935246;
        auVar28._28_4_ = 0.0048935246;
        auVar4 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar4),auVar28);
        local_3e0 = local_9c0;
        uStack_3d8 = uStack_9b8;
        uStack_9b0 = auVar68._16_8_;
        uStack_3d0 = uStack_9b0;
        uStack_9a8 = (ulong)(uint)(float)uStack_8c8;
        uStack_3c8 = uStack_9a8;
        local_9e0._0_8_ = auVar4._0_8_;
        local_400 = local_9e0._0_8_;
        local_9e0._8_8_ = auVar4._8_8_;
        uStack_3f8 = local_9e0._8_8_;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        auVar17._16_8_ = uStack_9b0;
        auVar17._0_16_ = _local_9c0;
        auVar17._24_4_ = (float)uStack_8c8;
        auVar17._28_4_ = 0;
        local_a00 = vdivps_avx(auVar17,ZEXT1632(auVar4));
        local_a60._0_4_ = local_620._0_4_;
        local_a60._4_4_ = local_620._4_4_;
        uStack_a58._0_4_ = local_620._8_4_;
        uStack_a58._4_4_ = local_620._12_4_;
        uStack_a50._0_4_ = auStack_610._0_4_;
        uStack_a50._4_4_ = auStack_610._4_4_;
        uStack_a48._0_4_ = auStack_610._8_4_;
        uStack_a48._4_4_ = auStack_610._12_4_;
        local_a80._0_4_ = local_a00._0_4_;
        local_a80._4_4_ = local_a00._4_4_;
        uStack_a78._0_4_ = local_a00._8_4_;
        uStack_a78._4_4_ = local_a00._12_4_;
        uStack_a70._0_4_ = local_a00._16_4_;
        uStack_a70._4_4_ = local_a00._20_4_;
        uStack_a68._0_4_ = local_a00._24_4_;
        uStack_a68._4_4_ = local_a00._28_4_;
        fStack_be4 = uStack_a48._4_4_ + uStack_a68._4_4_;
        local_1620 = CONCAT44(local_a60._4_4_ + local_a80._4_4_,(float)local_a60 + (float)local_a80)
        ;
        uStackY_1618 = CONCAT44(uStack_a58._4_4_ + uStack_a78._4_4_,
                                (float)uStack_a58 + (float)uStack_a78);
        uStackY_1610 = CONCAT44(uStack_a50._4_4_ + uStack_a70._4_4_,
                                (float)uStack_a50 + (float)uStack_a70);
        uStackY_1608 = CONCAT44(fStack_be4,(float)uStack_a48 + (float)uStack_a68);
        local_ba0 = local_1620;
        uStack_b98 = uStackY_1618;
        uStack_b90 = uStackY_1610;
        uStack_b88 = uStackY_1608;
        local_c00 = ((float)local_a60 + (float)local_a80) * (float)local_aa0;
        fStack_bfc = (local_a60._4_4_ + local_a80._4_4_) * local_aa0._4_4_;
        fStack_bf8 = ((float)uStack_a58 + (float)uStack_a78) * (float)uStack_a98;
        fStack_bf4 = (uStack_a58._4_4_ + uStack_a78._4_4_) * uStack_a98._4_4_;
        fStack_bf0 = ((float)uStack_a50 + (float)uStack_a70) * (float)uStack_a90;
        fStack_bec = (uStack_a50._4_4_ + uStack_a70._4_4_) * uStack_a90._4_4_;
        fStack_be8 = ((float)uStack_a48 + (float)uStack_a68) * (float)uStack_a88;
        local_be0._0_4_ = local_660._0_4_;
        local_be0._4_4_ = local_660._4_4_;
        uStack_bd8._0_4_ = local_660._8_4_;
        uStack_bd8._4_4_ = local_660._12_4_;
        uStack_bd0._0_4_ = auStack_650._0_4_;
        uStack_bd0._4_4_ = auStack_650._4_4_;
        uStack_bc8._0_4_ = auStack_650._8_4_;
        uStack_bc8._4_4_ = auStack_650._12_4_;
        local_1620 = CONCAT44(local_be0._4_4_ * fStack_bfc,(float)local_be0 * local_c00);
        uStackY_1618 = CONCAT44(uStack_bd8._4_4_ * fStack_bf4,(float)uStack_bd8 * fStack_bf8);
        uStackY_1610 = CONCAT44(uStack_bd0._4_4_ * fStack_bec,(float)uStack_bd0 * fStack_bf0);
        uStackY_1608 = CONCAT44(uStack_bc8._4_4_,(float)uStack_bc8 * fStack_be8);
        local_898 = local_1300;
        local_8c0 = local_1620;
        uStack_8b8 = uStackY_1618;
        uStack_8b0 = uStackY_1610;
        uStack_8a8 = uStackY_1608;
        *(undefined8 *)*local_1300 = local_1620;
        *(undefined8 *)(*local_1300 + 8) = uStackY_1618;
        *(undefined8 *)(*local_1300 + 0x10) = uStackY_1610;
        *(undefined8 *)(*local_1300 + 0x18) = uStackY_1608;
        local_1300 = (undefined1 (*) [64])(*local_1300 + 0x20);
        local_be0 = local_660._0_8_;
        uStack_bd8 = local_660._8_8_;
        uStack_bd0 = auStack_650._0_8_;
        uStack_bc8 = auStack_650._8_8_;
        pOStack_ba8 = in_stack_ffffffffffffea38;
        local_b60 = local_5e0._0_8_;
        uStack_b58 = local_5e0._8_8_;
        uStack_b50 = auStack_5d0._0_8_;
        uStack_b48 = auStack_5d0._8_8_;
        local_b20 = (Mat *)local_5a0._0_8_;
        uStack_b18 = (GELU *)local_5a0._8_8_;
        uStack_b10 = uStack_590;
        uStack_b08 = uStack_588;
        local_ae0 = local_bc0;
        uStack_ad8 = uStack_bb8;
        uStack_ad0 = uStack_bb0;
        pOStack_ac8 = in_stack_ffffffffffffea38;
        local_ac0 = local_bc0;
        uStack_ab8 = uStack_bb8;
        uStack_ab0 = uStack_bb0;
        pOStack_aa8 = in_stack_ffffffffffffea38;
        local_aa0 = local_bc0;
        uStack_a98 = uStack_bb8;
        uStack_a90 = uStack_bb0;
        uStack_a88 = in_stack_ffffffffffffea38;
        local_a80 = local_a00._0_8_;
        uStack_a78 = local_a00._8_8_;
        uStack_a70 = local_a00._16_8_;
        uStack_a68 = local_a00._24_8_;
        local_a60 = local_620._0_8_;
        uStack_a58 = local_620._8_8_;
        uStack_a50 = auStack_610._0_8_;
        uStack_a48 = auStack_610._8_8_;
        local_a20 = local_bc0;
        uStack_a18 = uStack_bb8;
        uStack_a10 = uStack_bb0;
        pOStack_a08 = in_stack_ffffffffffffea38;
        local_9e0 = ZEXT1632(auVar4);
        _local_9c0 = auVar3;
        local_920 = uVar5;
        uStack_918 = uVar6;
        local_8e0 = local_980._0_8_;
        uStack_8d8 = local_980._8_8_;
        uStack_8d0 = local_980._16_8_;
        uStack_8c8 = local_980._24_8_;
      }
      local_81c = 0x3f000000;
      local_830 = 0x3f000000;
      uStack_82c = 0x3f000000;
      uStack_828 = 0x3f000000;
      uStack_824 = 0x3f000000;
      local_834 = 0x3f800000;
      local_850 = 0x3f800000;
      uStack_84c = 0x3f800000;
      uStack_848 = 0x3f800000;
      uStack_844 = 0x3f800000;
      local_854 = 0x3f4c4229;
      local_870 = 0x3f4c4229;
      uStack_86c = 0x3f4c4229;
      uStack_868 = 0x3f4c4229;
      uStack_864 = 0x3f4c4229;
      local_874 = 0x3d372713;
      local_890 = 0x3d372713;
      uStack_88c = 0x3d372713;
      uStack_888 = 0x3d372713;
      uStack_884 = 0x3d372713;
      in_stack_ffffffffffffea40 = (Mat *)local_5a0._0_8_;
      in_stack_ffffffffffffea48 = (GELU *)local_5a0._8_8_;
      in_stack_ffffffffffffea50 = uStack_590;
      in_stack_ffffffffffffea58 = uStack_588;
      in_stack_ffffffffffffea60 = local_5e0._0_8_;
      in_stack_ffffffffffffea68 = local_5e0._8_8_;
      in_stack_ffffffffffffea70 = auStack_5d0._0_8_;
      _local_5a0 = auVar76;
      for (; local_1358 + 3 < local_12f0; local_1358 = local_1358 + 4) {
        local_818 = local_1300;
        uVar5 = *(undefined8 *)*local_1300;
        uVar6 = *(undefined8 *)(*local_1300 + 8);
        local_760._0_4_ = (float)uVar5;
        fVar74 = (float)local_760;
        local_760._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fVar77 = local_760._4_4_;
        uStack_758._0_4_ = (float)uVar6;
        fVar78 = (float)uStack_758;
        uStack_758._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fVar81 = uStack_758._4_4_;
        local_790 = CONCAT44(local_760._4_4_ * local_760._4_4_,(float)local_760 * (float)local_760);
        uStack_788 = CONCAT44(uStack_758._4_4_ * uStack_758._4_4_,
                              (float)uStack_758 * (float)uStack_758);
        fVar83 = (float)local_760 * (float)local_760 * (float)local_760;
        fVar85 = local_760._4_4_ * local_760._4_4_ * local_760._4_4_;
        fVar86 = (float)uStack_758 * (float)uStack_758 * (float)uStack_758;
        fVar82 = uStack_758._4_4_ * uStack_758._4_4_ * uStack_758._4_4_;
        local_7b0 = CONCAT44(fVar85,fVar83);
        uStack_7a8 = CONCAT44(fVar82,fVar86);
        fVar83 = fVar83 * 0.044715;
        fVar85 = fVar85 * 0.044715;
        fVar86 = fVar86 * 0.044715;
        fVar82 = fVar82 * 0.044715;
        local_1690 = CONCAT44(fVar85,fVar83);
        uStackY_1688 = CONCAT44(fVar82,fVar86);
        local_730 = local_1690;
        uStack_728 = uStackY_1688;
        local_760._0_4_ = (float)local_760 + fVar83;
        local_760._4_4_ = local_760._4_4_ + fVar85;
        uStack_758._0_4_ = (float)uStack_758 + fVar86;
        uStack_758._4_4_ = uStack_758._4_4_ + fVar82;
        local_1690 = CONCAT44(local_760._4_4_,(float)local_760);
        uStackY_1688 = CONCAT44(uStack_758._4_4_,(float)uStack_758);
        local_7d0 = local_1690;
        uStack_7c8 = uStackY_1688;
        uStackY_1688 = CONCAT44(uStack_758._4_4_ * 0.7978845,(float)uStack_758 * 0.7978845);
        afVar92[2] = 0.7978845;
        afVar92[3] = 0.7978845;
        afVar92[0] = (float)local_760 * 0.7978845;
        afVar92[1] = local_760._4_4_ * 0.7978845;
        uVar80 = uStackY_1688;
        local_7c0 = 0x3f4c42293f4c4229;
        uStack_7b8 = 0x3f4c42293f4c4229;
        local_7a0 = 0x3d3727133d372713;
        uStack_798 = 0x3d3727133d372713;
        local_780 = uVar5;
        uStack_778 = uVar6;
        local_770 = uVar5;
        uStack_768 = uVar6;
        local_760 = uVar5;
        uStack_758 = uVar6;
        local_720 = uVar5;
        uStack_718 = uVar6;
        afVar92 = tanh_ps(afVar92);
        local_750._0_4_ = afVar92[0];
        local_750._4_4_ = afVar92[1];
        uStack_748._0_4_ = (float)uVar80;
        uStack_748._4_4_ = (float)((ulong)uVar80 >> 0x20);
        local_1690 = CONCAT44(local_750._4_4_ + 1.0,(float)local_750 + 1.0);
        uStackY_1688 = CONCAT44(uStack_748._4_4_ + 1.0,(float)uStack_748 + 1.0);
        local_7e0 = local_1690;
        uStack_7d8 = uStackY_1688;
        local_810 = ((float)local_750 + 1.0) * fVar74;
        fStack_80c = (local_750._4_4_ + 1.0) * fVar77;
        fStack_808 = ((float)uStack_748 + 1.0) * fVar78;
        fStack_804 = (uStack_748._4_4_ + 1.0) * fVar81;
        local_1690 = CONCAT44(fStack_80c * 0.5,local_810 * 0.5);
        uStackY_1688 = CONCAT44(fStack_804 * 0.5,fStack_808 * 0.5);
        local_6f8 = local_1300;
        local_710 = local_1690;
        uStack_708 = uStackY_1688;
        *(undefined8 *)*local_1300 = local_1690;
        *(undefined8 *)(*local_1300 + 8) = uStackY_1688;
        local_1300 = (undefined1 (*) [64])(*local_1300 + 0x10);
        local_800 = 0x3f0000003f000000;
        uStack_7f8 = 0x3f0000003f000000;
        local_7f0 = uVar5;
        uStack_7e8 = uVar6;
        local_750 = afVar92._0_8_;
        uStack_748 = uVar80;
        local_740 = 0x3f8000003f800000;
        uStack_738 = 0x3f8000003f800000;
      }
      for (; local_1358 < local_12f0; local_1358 = local_1358 + 1) {
        fVar74 = *(float *)*local_1300;
        fVar77 = tanhf((*(float *)*local_1300 +
                       *(float *)*local_1300 * 0.044715 * *(float *)*local_1300 *
                       *(float *)*local_1300) * 0.7978845);
        *(float *)*local_1300 = fVar74 * 0.5 * (fVar77 + 1.0);
        local_1300 = (undefined1 (*) [64])(*local_1300 + 4);
      }
    }
    local_12bc = 0;
  }
  return local_12bc;
}

Assistant:

int GELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}